

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O2

CTcSymObj * __thiscall
CTcParser::find_or_def_gramprod(CTcParser *this,char *txt,size_t len,CTcGramProdEntry **entryp)

{
  undefined1 *puVar1;
  vm_obj_id_t obj_id;
  size_t len_00;
  CTcSymObj *this_00;
  CTcGramProdEntry *pCVar2;
  char *pcVar3;
  int errnum;
  
  pcVar3 = txt;
  this_00 = (CTcSymObj *)CTcPrsSymtab::find(this->global_symtab_,txt,len);
  if (this_00 == (CTcSymObj *)0x0) {
    this_00 = (CTcSymObj *)CTcSymbolBase::operator_new((CTcSymbolBase *)0xc0,(size_t)pcVar3);
    pcVar3 = (G_tok->curtok_).text_;
    len_00 = (G_tok->curtok_).text_len_;
    obj_id = G_cg->next_obj_;
    G_cg->next_obj_ = obj_id + 1;
    CTcSymObj::CTcSymObj(this_00,pcVar3,len_00,0,obj_id,0,TC_META_GRAMPROD,(CTcDictEntry *)0x0);
    (*this->global_symtab_->_vptr_CTcPrsSymtab[3])(this->global_symtab_,this_00);
  }
  else {
    errnum = 0x2b60;
    if ((*(int *)&((CVmHashEntry *)
                  &(this_00->super_CTcSymObjBase).super_CTcSymbol.super_CTcSymbolBase)->field_0x24
         == 2) && (errnum = 0x2b87, (this_00->super_CTcSymObjBase).metaclass_ == TC_META_GRAMPROD))
    {
      puVar1 = &(this_00->super_CTcSymObjBase).field_0xb8;
      *puVar1 = *puVar1 & 0xfe;
      pCVar2 = (CTcGramProdEntry *)(this_00->super_CTcSymObjBase).meta_extra_;
      if (pCVar2 != (CTcGramProdEntry *)0x0) goto LAB_001e136a;
    }
    else {
      this_00 = (CTcSymObj *)0x0;
      CTcTokenizer::log_error(errnum,len & 0xffffffff,txt);
    }
  }
  pCVar2 = create_gramprod_entry(this,this_00);
LAB_001e136a:
  if (entryp != (CTcGramProdEntry **)0x0) {
    *entryp = pCVar2;
  }
  return this_00;
}

Assistant:

CTcSymObj *CTcParser::find_or_def_gramprod(const char *txt, size_t len,
                                           CTcGramProdEntry **entryp)
{
    CTcSymObj *sym;
    CTcGramProdEntry *entry;

    /* look up the symbol */
    sym = (CTcSymObj *)global_symtab_->find(txt, len);

    /* if it's not defined, add it; otherwise, make sure it's correct */
    if (sym == 0)
    {
        /* it's not yet defined - define it as a grammar production */
        sym = new CTcSymObj(G_tok->getcur()->get_text(),
                            G_tok->getcur()->get_text_len(),
                            FALSE, G_cg->new_obj_id(), FALSE,
                            TC_META_GRAMPROD, 0);

        /* add it to the global symbol table */
        global_symtab_->add_entry(sym);

        /* create a new production list entry */
        entry = create_gramprod_entry(sym);
    }
    else
    {
        /* make sure it's an object of metaclass 'grammar production' */
        if (sym->get_type() != TC_SYM_OBJ)
        {
            /* log an error */
            G_tok->log_error(TCERR_REDEF_AS_OBJ, (int)len, txt);

            /* forget the symbol - it's not even an object */
            sym = 0;
        }
        else if (sym->get_metaclass() != TC_META_GRAMPROD)
        {
            /* it's an object, but not a production - log an error */
            G_tok->log_error(TCERR_REDEF_AS_GRAMPROD, (int)len, txt);

            /* forget the symbol */
            sym = 0;
        }

        /* 
         *   If we found the symbol, make sure it's not marked as external,
         *   since we're actually defining a rule for this production.  If
         *   the production is exported from any other modules, we'll share
         *   the production object with the other modules.  
         */
        if (sym != 0)
            sym->set_extern(FALSE);

        /* get the existing production object, if any */
        entry = get_gramprod_entry(sym);

        /* 
         *   if we didn't find the entry, we must have loaded the symbol from
         *   a symbol file - add the entry now 
         */
        if (entry == 0)
            entry = create_gramprod_entry(sym);
    }

    /* 
     *   if the caller is interested in knowing the associated grammar rule
     *   list entry, return it 
     */
    if (entryp != 0)
        *entryp = entry;

    /* return the new symbol */
    return sym;
}